

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_gYearMonth(void)

{
  char cVar1;
  bool bVar2;
  XSValue_Data *pXVar3;
  XSValue *pXVar4;
  long lVar5;
  int iVar6;
  void *pvVar7;
  char *pcVar8;
  char *pcVar9;
  Status myStatus;
  char iv_1 [8];
  char iv_2 [9];
  char iv_3 [11];
  char v_3 [14];
  char v_2 [14];
  char v_1 [16];
  Status local_114;
  StrX local_110;
  char local_100 [8];
  undefined8 local_f8;
  undefined1 local_f0;
  char local_e8 [16];
  char local_d8 [16];
  char local_c8 [16];
  char local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_strncpy(local_b8,"   20000-02   \n",0x10);
  builtin_strncpy(local_c8 + 8,"14:00",6);
  builtin_strncpy(local_c8,"0200-11+",8);
  builtin_strncpy(local_d8 + 8,"14:00",6);
  builtin_strncpy(local_d8,"2000-02-",8);
  builtin_strncpy(local_100,"0000-12",8);
  local_f8 = 0x31312d303030322b;
  local_f0 = 0;
  builtin_strncpy(local_e8,"2000.90-02",0xb);
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf60,local_b8,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf61,local_c8,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf62,local_d8,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    if (local_114 != st_FOCA0002) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      if ((ulong)local_114 < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xf65,local_100,local_110.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_001248aa;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf65,local_100,local_110.fLocalForm,0);
LAB_001248aa:
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    if (local_114 != st_FOCA0002) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      if ((ulong)local_114 < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xf66,&local_f8,local_110.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_001249a7;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf66,&local_f8,local_110.fLocalForm,0);
LAB_001249a7:
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    if (local_114 == st_FOCA0002) goto LAB_00124ab9;
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
    if ((ulong)local_114 < 0xb) {
      pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
    }
    else {
      pcVar8 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xf67,local_e8,local_110.fLocalForm,"st_FOCA0002",pcVar8);
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xf67,local_e8,local_110.fLocalForm,0);
  }
  StrX::~StrX(&local_110);
  errSeen = 1;
LAB_00124ab9:
  iVar6 = 1;
  do {
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar7 = (void *)0x9;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf81,local_b8);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      uStack_50 = 0x200004e20;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      bVar2 = compareActualValue(dt_gYearMonth,*pXVar3,
                                 (XSValue_Data)ZEXT1640(CONCAT88(0x200004e20,local_58)));
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar7 = (void *)0x9;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf82,local_c8);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      uStack_78 = 0xb000000c8;
      local_70 = 0;
      uStack_68 = 0;
      local_60 = 0;
      bVar2 = compareActualValue(dt_gYearMonth,*pXVar3,
                                 (XSValue_Data)ZEXT1640(CONCAT88(0xb000000c8,local_80)));
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar7 = (void *)0x9;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf83,local_d8);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      uStack_a0 = 0x2000007d0;
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      bVar2 = compareActualValue(dt_gYearMonth,*pXVar3,
                                 (XSValue_Data)ZEXT1640(CONCAT88(0x2000007d0,local_a8)));
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_114 != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xf86,local_100,local_110.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      pvVar7 = (void *)0xf86;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf86,local_100);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar7);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_114 != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xf87,&local_f8,local_110.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      pvVar7 = (void *)0xf87;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf87,&local_f8);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar7);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_114 != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xf88,local_e8,local_110.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      pvVar7 = (void *)0xf88;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf88,local_e8);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar7);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 == 0);
  iVar6 = 1;
  do {
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (local_114 != st_NoCanRep) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfa4,local_b8,local_110.fLocalForm,"st_NoCanRep",pcVar8);
        StrX::~StrX(&local_110);
        goto LAB_001252db;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfa4,local_b8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_001252db:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (local_114 != st_NoCanRep) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfa5,local_c8,local_110.fLocalForm,"st_NoCanRep",pcVar8);
        StrX::~StrX(&local_110);
        goto LAB_001253f0;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfa5,local_c8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_001253f0:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (local_114 != st_NoCanRep) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfa6,local_d8,local_110.fLocalForm,"st_NoCanRep",pcVar8);
        StrX::~StrX(&local_110);
        goto LAB_00125503;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfa6,local_d8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00125503:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if ((uint)(iVar6 == 1) * 4 + st_NoCanRep != local_114) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
        pcVar8 = "st_NoCanRep";
        if (iVar6 == 1) {
          pcVar8 = "st_FOCA0002";
        }
        pcVar9 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar9 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfaa,local_100,local_110.fLocalForm,pcVar8,pcVar9);
        StrX::~StrX(&local_110);
        goto LAB_0012562b;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfaa,local_100);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_0012562b:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if ((uint)(iVar6 == 1) * 4 + st_NoCanRep != local_114) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
        pcVar8 = "st_NoCanRep";
        if (iVar6 == 1) {
          pcVar8 = "st_FOCA0002";
        }
        pcVar9 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar9 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfac,&local_f8,local_110.fLocalForm,pcVar8,pcVar9);
        StrX::~StrX(&local_110);
        goto LAB_00125753;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfac,&local_f8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00125753:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gYearMonth,&local_114,ver_10,iVar6 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if ((uint)(iVar6 == 1) * 4 + st_NoCanRep != local_114) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
        pcVar8 = "st_NoCanRep";
        if (iVar6 == 1) {
          pcVar8 = "st_FOCA0002";
        }
        pcVar9 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar9 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xfae,local_e8,local_110.fLocalForm,pcVar8,pcVar9);
        StrX::~StrX(&local_110);
        goto LAB_00125884;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xfae,local_e8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00125884:
      errSeen = 1;
    }
    iVar6 = iVar6 + -1;
    if (iVar6 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_gYearMonth()
{
    const XSValue::DataType dt = XSValue::dt_gYearMonth;
    bool  toValidate = true;

    const char v_1[]="   20000-02   \n";
    const char v_2[]="0200-11+14:00";
    const char v_3[]="2000-02-14:00";

    const char iv_1[]="0000-12";
    const char iv_2[]="+2000-11";
    const char iv_3[]="2000.90-02";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    act_v_ran_v_1.fValue.f_datetime.f_year    = 20000;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 02;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 200;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 11;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 02;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;
    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));

    }

}